

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

bool __thiscall
hwnet::TCPConnector::Connect(TCPConnector *this,ConnectCallback *connectFn,ErrorCallback *errorFn)

{
  Poller *this_00;
  bool bVar1;
  int iVar2;
  socklen_t __len;
  int *piVar3;
  Ptr local_50;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  bool local_29 [8];
  bool expected;
  
  local_29[0] = false;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->started,local_29,true,memory_order_seq_cst);
  if (bVar1) {
    std::function<void_(int)>::operator=(&this->connectCallback_,connectFn);
    std::function<void_(int,_const_hwnet::Addr_&)>::operator=(&this->errorCallback_,errorFn);
    if (((this->connectCallback_).super__Function_base._M_manager != (_Manager_type)0x0) &&
       ((this->remoteAddr).addrType - 1U < 3)) {
      iVar2 = socket((this->remoteAddr).family,1,6);
      this->fd = iVar2;
      if (-1 < iVar2) {
        SetNoBlock(iVar2,true);
        SetCloseOnExec(this->fd);
        iVar2 = this->fd;
        __len = Addr::AddrLen(&this->remoteAddr);
        iVar2 = connect(iVar2,(sockaddr *)&this->remoteAddr,__len);
        if ((iVar2 == 0) || (piVar3 = __errno_location(), *piVar3 == 0x73)) {
          std::mutex::lock(&this->mtx);
          this_00 = this->poller_;
          std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<hwnet::TCPConnector,void>
                    ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                     (__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<hwnet::TCPConnector>);
          local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(local_40 + 8);
          if (local_40 == 0) {
            local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
          }
          local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = _Stack_38._M_pi;
          local_40 = 0;
          _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Poller::Add(this_00,&local_50,4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
          pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
          return true;
        }
        close(this->fd);
        this->fd = -1;
      }
    }
  }
  return false;
}

Assistant:

bool TCPConnector::Connect(const ConnectCallback &connectFn,const ErrorCallback &errorFn) {

	bool expected = false;
	if(!this->started.compare_exchange_strong(expected,true)) {
		return false;
	}

	this->connectCallback_ = connectFn;
	this->errorCallback_ = errorFn;


	if(!this->connectCallback_) {
		return false;
	}

	if(!this->remoteAddr.IsVaild()) {
		return false;
	}

	this->fd = ::socket(this->remoteAddr.Family(),SOCK_STREAM,IPPROTO_TCP);
		
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	SetCloseOnExec(this->fd);

    int ret = ::connect(this->fd,this->remoteAddr.Address(),this->remoteAddr.AddrLen());

    if(ret == 0 || errno == EINPROGRESS) {
		std::lock_guard<std::mutex> guard(this->mtx);
    	this->poller_->Add(shared_from_this(),Poller::Write);
    	return true;
    } else {
    	::close(this->fd);
    	this->fd = -1;
    	return false;
    }
}